

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

Sbl_Man_t * Sbl_ManAlloc(Gia_Man_t *pGia,int Number)

{
  byte bVar1;
  int **ppiVar2;
  int iVar3;
  uint uVar4;
  Sbl_Man_t *pSVar5;
  sat_solver *psVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Hsh_VecMan_t *pHVar9;
  Vec_Wec_t *pVVar10;
  Vec_Wrd_t *pVVar11;
  word *pwVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  
  pSVar5 = (Sbl_Man_t *)calloc(1,0x198);
  uVar15 = 0x1f;
  if (Number - 1U != 0) {
    for (; Number - 1U >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  iVar3 = (uVar15 ^ 0xffffffe0) + 0x21;
  if ((uint)Number < 2) {
    iVar3 = Number;
  }
  pSVar5->nVars = Number;
  pSVar5->LogN = iVar3;
  pSVar5->Power2 = 1 << ((byte)iVar3 & 0x1f);
  psVar6 = Sbm_AddCardinSolver(iVar3,&pSVar5->vCardVars);
  pSVar5->pSat = psVar6;
  iVar3 = sat_solver_nvars(psVar6);
  pSVar5->FirstVar = iVar3;
  psVar6 = pSVar5->pSat;
  if (psVar6->qhead != psVar6->qtail) {
    __assert_fail("s->qhead == s->qtail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x137,"void sat_solver_bookmark(sat_solver *)");
  }
  iVar3 = psVar6->size;
  psVar6->iVarPivot = iVar3;
  psVar6->iTrailPivot = psVar6->qhead;
  *(undefined8 *)(psVar6->Mem).BookMarkE = *(undefined8 *)(psVar6->Mem).nEntries;
  iVar13 = (psVar6->Mem).iPage[0];
  bVar1 = (byte)(psVar6->Mem).nPageSize;
  ppiVar2 = (psVar6->Mem).pPages;
  (psVar6->Mem).BookMarkH[0] = iVar13 << (bVar1 & 0x1f) | *ppiVar2[iVar13];
  iVar13 = (psVar6->Mem).iPage[1];
  (psVar6->Mem).BookMarkH[1] = iVar13 << (bVar1 & 0x1f) | *ppiVar2[iVar13];
  if (psVar6->activity2 != (word *)0x0) {
    psVar6->var_inc2 = psVar6->var_inc;
    memcpy(psVar6->activity2,psVar6->activity,(long)iVar3 << 3);
  }
  pSVar5->pGia = pGia;
  iVar3 = pSVar5->nVars;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar13 = iVar3;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar13;
  lVar16 = (long)iVar13;
  if (iVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc(lVar16 * 4);
  }
  pVVar7->pArray = piVar8;
  pSVar5->vLeaves = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar13;
  if (iVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc(lVar16 * 4);
  }
  pVVar7->pArray = piVar8;
  pSVar5->vAnds = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar13;
  if (iVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc(lVar16 * 4);
  }
  pVVar7->pArray = piVar8;
  pSVar5->vNodes = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar13;
  if (iVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc(lVar16 * 4);
  }
  pVVar7->pArray = piVar8;
  pSVar5->vRoots = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar13;
  if (iVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc(lVar16 << 2);
  }
  pVVar7->pArray = piVar8;
  pSVar5->vRootVars = pVVar7;
  pHVar9 = (Hsh_VecMan_t *)calloc(1,0x48);
  uVar15 = 999;
  while( true ) {
    do {
      uVar14 = uVar15;
      uVar15 = uVar14 + 1;
    } while ((uVar14 & 1) != 0);
    if (uVar15 < 9) break;
    iVar3 = 5;
    while (uVar15 % (iVar3 - 2U) != 0) {
      uVar4 = iVar3 * iVar3;
      iVar3 = iVar3 + 2;
      if (uVar15 < uVar4) goto LAB_007ad275;
    }
  }
LAB_007ad275:
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar14) {
    uVar4 = uVar15;
  }
  pVVar7->nCap = uVar4;
  piVar8 = (int *)malloc((long)(int)uVar4 << 2);
  pVVar7->pArray = piVar8;
  pVVar7->nSize = uVar15;
  if (piVar8 != (int *)0x0) {
    memset(piVar8,0xff,(long)(int)uVar15 << 2);
  }
  pHVar9->vTable = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 4000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(16000);
  pVVar7->pArray = piVar8;
  pHVar9->vData = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  pHVar9->vMap = pVVar7;
  pSVar5->pHash = pHVar9;
  pVVar7 = (Vec_Int_t *)calloc(1,0x10);
  pSVar5->vArrs = pVVar7;
  pVVar7 = (Vec_Int_t *)calloc(1,0x10);
  pSVar5->vReqs = pVVar7;
  pVVar10 = (Vec_Wec_t *)malloc(0x10);
  pVVar10->nCap = 0x80;
  pVVar10->nSize = 0;
  pVVar7 = (Vec_Int_t *)calloc(0x80,0x10);
  pVVar10->pArray = pVVar7;
  pSVar5->vWindow = pVVar10;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x20;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x80);
  pVVar7->pArray = piVar8;
  pSVar5->vPath = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x20;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x80);
  pVVar7->pArray = piVar8;
  pSVar5->vEdges = pVVar7;
  pVVar11 = (Vec_Wrd_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  pwVar12 = (word *)malloc(8000);
  pVVar11->pArray = pwVar12;
  pSVar5->vCutsI1 = pVVar11;
  pVVar11 = (Vec_Wrd_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  pwVar12 = (word *)malloc(8000);
  pVVar11->pArray = pwVar12;
  pSVar5->vCutsI2 = pVVar11;
  pVVar11 = (Vec_Wrd_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  pwVar12 = (word *)malloc(8000);
  pVVar11->pArray = pwVar12;
  pSVar5->vCutsN1 = pVVar11;
  pVVar11 = (Vec_Wrd_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  pwVar12 = (word *)malloc(8000);
  pVVar11->pArray = pwVar12;
  pSVar5->vCutsN2 = pVVar11;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x40;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x100);
  pVVar7->pArray = piVar8;
  pSVar5->vCutsNum = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x40;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x100);
  pVVar7->pArray = piVar8;
  pSVar5->vCutsStart = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  pSVar5->vCutsObj = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x40;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x100);
  pVVar7->pArray = piVar8;
  pSVar5->vSolInit = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x40;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x100);
  pVVar7->pArray = piVar8;
  pSVar5->vSolCur = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x40;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x100);
  pVVar7->pArray = piVar8;
  pSVar5->vSolBest = pVVar7;
  pVVar11 = (Vec_Wrd_t *)malloc(0x10);
  pVVar11->nCap = 0x20;
  pVVar11->nSize = 0;
  pwVar12 = (word *)malloc(0x100);
  pVVar11->pArray = pwVar12;
  pSVar5->vTempI1 = pVVar11;
  pVVar11 = (Vec_Wrd_t *)malloc(0x10);
  pVVar11->nCap = 0x20;
  pVVar11->nSize = 0;
  pwVar12 = (word *)malloc(0x100);
  pVVar11->pArray = pwVar12;
  pSVar5->vTempI2 = pVVar11;
  pVVar11 = (Vec_Wrd_t *)malloc(0x10);
  pVVar11->nCap = 0x20;
  pVVar11->nSize = 0;
  pwVar12 = (word *)malloc(0x100);
  pVVar11->pArray = pwVar12;
  pSVar5->vTempN1 = pVVar11;
  pVVar11 = (Vec_Wrd_t *)malloc(0x10);
  pVVar11->nCap = 0x20;
  pVVar11->nSize = 0;
  pwVar12 = (word *)malloc(0x100);
  pVVar11->pArray = pwVar12;
  pSVar5->vTempN2 = pVVar11;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x40;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x100);
  pVVar7->pArray = piVar8;
  pSVar5->vLits = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x40;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x100);
  pVVar7->pArray = piVar8;
  pSVar5->vAssump = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  pSVar5->vPolar = pVVar7;
  Gia_ManFillValue(pGia);
  return pSVar5;
}

Assistant:

Sbl_Man_t * Sbl_ManAlloc( Gia_Man_t * pGia, int Number )
{
    Sbl_Man_t * p = ABC_CALLOC( Sbl_Man_t, 1 );
    p->nVars      = Number;
    p->LogN       = Abc_Base2Log(Number);
    p->Power2     = 1 << p->LogN;
    p->pSat       = Sbm_AddCardinSolver( p->LogN, &p->vCardVars );
    p->FirstVar   = sat_solver_nvars( p->pSat );
    sat_solver_bookmark( p->pSat );
    // window
    p->pGia       = pGia;
    p->vLeaves    = Vec_IntAlloc( p->nVars );
    p->vAnds      = Vec_IntAlloc( p->nVars );
    p->vNodes     = Vec_IntAlloc( p->nVars );
    p->vRoots     = Vec_IntAlloc( p->nVars );
    p->vRootVars  = Vec_IntAlloc( p->nVars );
    p->pHash      = Hsh_VecManStart( 1000 );
    // timing
    p->vArrs      = Vec_IntAlloc( 0 );
    p->vReqs      = Vec_IntAlloc( 0 );
    p->vWindow    = Vec_WecAlloc( 128 );
    p->vPath      = Vec_IntAlloc( 32 );
    p->vEdges     = Vec_IntAlloc( 32 );
    // cuts
    p->vCutsI1    = Vec_WrdAlloc( 1000 );     // input bit patterns
    p->vCutsI2    = Vec_WrdAlloc( 1000 );     // input bit patterns
    p->vCutsN1    = Vec_WrdAlloc( 1000 );     // node bit patterns
    p->vCutsN2    = Vec_WrdAlloc( 1000 );     // node bit patterns
    p->vCutsNum   = Vec_IntAlloc( 64 );       // cut counts for each obj
    p->vCutsStart = Vec_IntAlloc( 64 );       // starting cuts for each obj
    p->vCutsObj   = Vec_IntAlloc( 1000 );
    p->vSolInit   = Vec_IntAlloc( 64 );
    p->vSolCur    = Vec_IntAlloc( 64 );
    p->vSolBest   = Vec_IntAlloc( 64 );
    p->vTempI1    = Vec_WrdAlloc( 32 ); 
    p->vTempI2    = Vec_WrdAlloc( 32 ); 
    p->vTempN1    = Vec_WrdAlloc( 32 ); 
    p->vTempN2    = Vec_WrdAlloc( 32 ); 
    // internal
    p->vLits      = Vec_IntAlloc( 64 );
    p->vAssump    = Vec_IntAlloc( 64 );
    p->vPolar     = Vec_IntAlloc( 1000 );
    // other
    Gia_ManFillValue( pGia );
    return p;
}